

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O1

void __thiscall UDPSplitPacketReader::read_packet(UDPSplitPacketReader *this)

{
  list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
  *this_00;
  size_t *psVar1;
  ushort uVar2;
  _Node *p_Var3;
  ulong uVar4;
  _List_node_base *p_Var5;
  uint uVar6;
  _List_node_base *in_RCX;
  int __fd;
  int in_R8D;
  _List_node_base *p_Var7;
  iterator it;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  bool bVar10;
  
  this_00 = &this->receivedPackets;
  do {
    if (((ulong)(long)this->max <=
         (this->receivedPackets).
         super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
         ._M_impl._M_node._M_size) || (this->receivedPacket == true)) {
      if (this->receivedPacket == true) {
        p_Var7 = (this->currentPacket)._M_node;
        this->receivedPacket = false;
      }
      else {
        p_Var7 = (this->receivedPackets).
                 super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
                 ._M_impl._M_node.super__List_node_base._M_prev;
      }
      if (*(char *)&p_Var7[5]._M_next == '\x01') {
        p_Var8 = p_Var7[3]._M_prev;
        p_Var5 = p_Var8 + 1;
        p_Var9 = p_Var8;
        if (*(char *)&p_Var8[5]._M_next == '\x01') {
          do {
            p_Var9 = p_Var8[3]._M_prev;
            psVar1 = &(this->receivedPackets).
                      super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
                      ._M_impl._M_node._M_size;
            *psVar1 = *psVar1 - 1;
            std::__detail::_List_node_base::_M_unhook();
            (*(code *)p_Var5->_M_next->_M_next)(p_Var5);
            operator_delete(p_Var8);
            p_Var5 = p_Var9 + 1;
            p_Var8 = p_Var9;
          } while (*(char *)&p_Var9[5]._M_next != '\0');
        }
        psVar1 = &(this->receivedPackets).
                  super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        (*(code *)(p_Var9[1]._M_next)->_M_next)(p_Var5);
        operator_delete(p_Var9);
      }
      if (*(char *)((long)&p_Var7[5]._M_next + 1) == '\x01') {
        p_Var8 = p_Var7[4]._M_next;
        p_Var5 = p_Var8 + 1;
        p_Var9 = p_Var8;
        if (*(char *)((long)&p_Var8[5]._M_next + 1) == '\x01') {
          do {
            p_Var8 = p_Var9[4]._M_next;
            psVar1 = &(this->receivedPackets).
                      super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
                      ._M_impl._M_node._M_size;
            *psVar1 = *psVar1 - 1;
            std::__detail::_List_node_base::_M_unhook();
            (*(code *)p_Var5->_M_next->_M_next)(p_Var5);
            operator_delete(p_Var9);
            p_Var5 = p_Var8 + 1;
            p_Var9 = p_Var8;
          } while (*(char *)((long)&p_Var8[5]._M_next + 1) != '\0');
        }
        psVar1 = &(this->receivedPackets).
                  super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        (*(code *)(p_Var8[1]._M_next)->_M_next)(p_Var5);
        operator_delete(p_Var8);
      }
      psVar1 = &(this->receivedPackets).
                super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      (*(code *)(p_Var7[1]._M_next)->_M_next)(p_Var7 + 1);
      operator_delete(p_Var7);
    }
    p_Var3 = std::__cxx11::
             list<UDPSplitPacketReader::SplitPacket,std::allocator<UDPSplitPacketReader::SplitPacket>>
             ::_M_create_node<int&>
                       ((list<UDPSplitPacketReader::SplitPacket,std::allocator<UDPSplitPacketReader::SplitPacket>>
                         *)this_00,&this->mtu);
    std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
    psVar1 = &(this->receivedPackets).
              super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    p_Var7 = (this->receivedPackets).
             super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    while( true ) {
      __fd = (int)p_Var7[1]._M_prev;
      uVar4 = recv(this,__fd,(void *)(ulong)(uint)(*(int *)&p_Var7[2]._M_prev - __fd),(size_t)in_RCX
                   ,in_R8D);
      in_RCX = p_Var7[1]._M_prev;
      p_Var7[3]._M_next = (_List_node_base *)((long)&in_RCX->_M_next + (uVar4 & 0xffffffff));
      p_Var7[2]._M_next = (_List_node_base *)((long)&(p_Var7[2]._M_next)->_M_next + 4);
      p_Var5 = ((this->receivedPackets).
                super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
                ._M_impl._M_node.super__List_node_base._M_next)->_M_next;
      bVar10 = p_Var5 == (_List_node_base *)this_00;
      if (bVar10) break;
      while ((*(short *)&in_RCX->_M_next !=
              *(short *)&(*(_List_node_base **)((long)(p_Var5 + 1) + 8))->_M_next ||
             (((*(ushort *)((long)&(*(_List_node_base **)((long)(p_Var5 + 1) + 8))->_M_next + 2) ^
               *(ushort *)((long)&in_RCX->_M_next + 2)) & 0x3fff) != 0))) {
        p_Var5 = p_Var5->_M_next;
        bVar10 = p_Var5 == (_List_node_base *)this_00;
        if (bVar10) goto LAB_001102d3;
      }
      if (bVar10) break;
      if (*(char *)&p_Var5[5]._M_next == '\x01') {
        *(undefined1 *)&p_Var7[5]._M_next = 1;
        p_Var8 = *(_List_node_base **)((long)(p_Var5 + 3) + 8);
        p_Var7[3]._M_prev = p_Var8;
        p_Var8[4]._M_next = p_Var7;
      }
      if (*(char *)((long)(p_Var5 + 5) + 1) == '\x01') {
        *(undefined1 *)((long)&p_Var7[5]._M_next + 1) = 1;
        p_Var8 = p_Var5[4]._M_next;
        p_Var7[4]._M_next = p_Var8;
        p_Var8[3]._M_prev = p_Var7;
      }
      *(undefined1 *)((long)&p_Var7[5]._M_next + 2) = *(undefined1 *)((long)(p_Var5 + 5) + 2);
      p_Var7[4]._M_prev = *(_List_node_base **)((long)(p_Var5 + 4) + 8);
      *(undefined1 *)((long)&p_Var7[5]._M_next + 3) = *(undefined1 *)((long)(p_Var5 + 5) + 3);
      psVar1 = &(this->receivedPackets).
                super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      (**(code **)p_Var5[1]._M_next)(p_Var5 + 1);
      operator_delete(p_Var5);
    }
LAB_001102d3:
    uVar2 = *(ushort *)((long)&(p_Var7[1]._M_prev)->_M_next + 2);
    if (uVar2 < 0x4000) {
      (this->currentPacket)._M_node = p_Var7;
      goto LAB_00110471;
    }
    p_Var5 = ((this_00->
              super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
              )._M_impl._M_node.super__List_node_base._M_next)->_M_next;
    bVar10 = p_Var5 == (_List_node_base *)this_00;
    if (!bVar10) {
      do {
        if ((*(short *)&(p_Var7[1]._M_prev)->_M_next == *(short *)&(p_Var5[1]._M_prev)->_M_next) &&
           (((*(ushort *)((long)&(p_Var5[1]._M_prev)->_M_next + 2) ^ uVar2 + 1) & 0x3fff) == 0)) {
          if (!bVar10) {
            *(undefined1 *)((long)&p_Var5[5]._M_next + 1) = 1;
            p_Var5[4]._M_next = p_Var7;
            *(undefined1 *)&p_Var7[5]._M_next = 1;
            p_Var7[3]._M_prev = p_Var5;
            *(undefined1 *)((long)&p_Var7[5]._M_next + 3) =
                 *(undefined1 *)((long)&p_Var5[5]._M_next + 3);
          }
          break;
        }
        p_Var5 = p_Var5->_M_next;
        bVar10 = p_Var5 == (_List_node_base *)this_00;
      } while (!bVar10);
    }
    uVar2 = *(ushort *)((long)&(p_Var7[1]._M_prev)->_M_next + 2);
    in_RCX = (_List_node_base *)(ulong)uVar2;
    if ((uVar2 & 0xc000) == 0x4000) {
      p_Var7[4]._M_prev = p_Var7;
      *(undefined1 *)((long)&p_Var7[5]._M_next + 2) = 1;
    }
    else {
      p_Var5 = ((this_00->
                super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
                )._M_impl._M_node.super__List_node_base._M_next)->_M_next;
      bVar10 = p_Var5 == (_List_node_base *)this_00;
      if (!bVar10) {
        uVar6 = uVar2 + 0x3fff;
        in_RCX = (_List_node_base *)(ulong)uVar6;
        do {
          if ((*(short *)&(p_Var7[1]._M_prev)->_M_next == *(short *)&(p_Var5[1]._M_prev)->_M_next)
             && (((*(ushort *)((long)&(p_Var5[1]._M_prev)->_M_next + 2) ^ (ushort)uVar6) & 0x3fff)
                 == 0)) {
            if (bVar10) break;
            in_RCX = (_List_node_base *)CONCAT71((uint7)(uint3)(uVar6 >> 8),1);
            *(undefined1 *)&p_Var5[5]._M_next = 1;
            p_Var5[3]._M_prev = p_Var7;
            *(undefined1 *)((long)&p_Var7[5]._M_next + 1) = 1;
            p_Var7[4]._M_next = p_Var5;
            if (*(char *)((long)&p_Var5[5]._M_next + 2) == '\x01') {
              *(undefined1 *)((long)&p_Var7[5]._M_next + 2) = 1;
              p_Var5 = p_Var5[4]._M_prev;
            }
            else {
              uVar6 = *(ushort *)((long)&(p_Var5[1]._M_prev)->_M_next + 2) & 0xc000;
              in_RCX = (_List_node_base *)(ulong)uVar6;
              if (uVar6 != 0x4000) break;
              *(undefined1 *)((long)&p_Var7[5]._M_next + 2) = 1;
            }
            p_Var7[4]._M_prev = p_Var5;
            break;
          }
          p_Var5 = p_Var5->_M_next;
          bVar10 = p_Var5 == (_List_node_base *)this_00;
        } while (!bVar10);
      }
    }
    if (*(char *)((long)&p_Var7[5]._M_next + 2) == '\x01') {
      if (*(char *)((long)&p_Var7[5]._M_next + 3) == '\x01') {
LAB_00110469:
        (this->currentPacket)._M_node = p_Var7[4]._M_prev;
LAB_00110471:
        this->receivedPacket = true;
        return;
      }
      p_Var5 = p_Var7;
      if (*(char *)&p_Var7[5]._M_next == '\x01') {
        do {
          p_Var5 = p_Var5[3]._M_prev;
          if (*(char *)((long)&p_Var5[5]._M_next + 3) == '\x01') goto LAB_00110469;
          *(undefined1 *)((long)&p_Var5[5]._M_next + 2) = 1;
          in_RCX = p_Var7[4]._M_prev;
          p_Var5[4]._M_prev = in_RCX;
        } while (*(char *)&p_Var5[5]._M_next != '\0');
      }
    }
    if ((*(char *)((long)&p_Var7[5]._M_next + 3) == '\x01') &&
       (*(char *)((long)&p_Var7[5]._M_next + 1) == '\x01')) {
      do {
        p_Var7 = p_Var7[4]._M_next;
        if (*(char *)((long)&p_Var7[5]._M_next + 2) == '\x01') goto LAB_00110469;
        *(undefined1 *)((long)&p_Var7[5]._M_next + 3) = 1;
      } while (*(char *)((long)&p_Var7[5]._M_next + 1) != '\0');
    }
  } while( true );
}

Assistant:

void UDPSplitPacketReader::read_packet() {
  while(1) {
    // erase old packets
    if (receivedPackets.size() >= max || receivedPacket) {
      list<SplitPacket>::iterator current;
      if(receivedPacket) {
        current = currentPacket;
        receivedPacket = false;
      } else {
        current = --receivedPackets.end();
      }
      if (current->hasNext) {
        list<SplitPacket>::iterator it;
        it = current->next;
        while (it->hasNext) {
          list<SplitPacket>::iterator temp;
          temp = it->next;
          receivedPackets.erase(it);
          it = temp;
        }
        receivedPackets.erase(it);
      }
      if (current->hasPrevious) {
        list<SplitPacket>::iterator it;
        it = current->previous;
        while (it->hasPrevious) {
          list<SplitPacket>::iterator temp;
          temp = it->previous;
          receivedPackets.erase(it);
          it = temp;
        }
        receivedPackets.erase(it);
      }
      receivedPackets.erase(current);
    }

    // create packet
    receivedPackets.emplace_front(mtu);
    list<SplitPacket>::iterator current;
    current = receivedPackets.begin();

    // read until copy not read;
    while (1) {
      // read packet
      int length = recv(current->buf_start, current->buf_end - current->buf_start);
      current->read_end = current->buf_start + length;
      current->buf_current += 4;

      //cout << current->getCount() << endl;
      //cout << *((uint32_t *)current->buf_start) << endl;

      // find copies
      list<SplitPacket>::iterator copy;
      for (copy = ++receivedPackets.begin(); copy != receivedPackets.end(); copy++) {
        if ((current->getID() == copy->getID()) && (current->getCount() == copy->getCount())) {
          break;
        }
      }
      // if copy found
      if (copy != receivedPackets.end()) {
        // replace old with new;
        if (copy->hasNext) {
          current->hasNext = true;
          current->next = copy->next;
          current->next->previous = current;
        }
        if (copy->hasPrevious) {
          current->hasPrevious = true;
          current->previous = copy->previous;
          current->previous->next = current;
        }
        current->hasStart = copy->hasStart;
        current->start = copy->start;
        current->hasEnd = copy->hasEnd;
        receivedPackets.erase(copy);
      } else {
        break;
      }
    }

    // if full packet
    if (current->isFull()) {
      currentPacket = current;
      receivedPacket = true;
      return;
    }

    // setup next and previous links
    // for start and middle packets
    if (!current->isEnd()) {
      // find the next one.
      list<SplitPacket>::iterator next;
      // findNext
      for (next = ++receivedPackets.begin(); next != receivedPackets.end(); next++) {
        if ((current->getID() == next->getID()) && (current->getNextCount() == next->getCount())) {
          break;
        }
      }
      // next found
      if (next != receivedPackets.end()) {
        next->hasPrevious = true;
        next->previous = current;
        current->hasNext = true;
        current->next = next;
        current->hasEnd = next->hasEnd;
      }
    // for end packets
    } else {
      current->hasEnd = true;
    }
    // for middle and end packets
    if (!current->isStart()) {
      list<SplitPacket>::iterator previous;
      // findPrevious
      // previous = findPrevious(current);
      for (previous = ++receivedPackets.begin(); previous != receivedPackets.end(); previous++) {
        if ((current->getID() == previous->getID()) && (current->getPreviousCount() == previous->getCount())) {
          break;
        }
      }
      // if previous found
      if (previous != receivedPackets.end()) {
        previous->hasNext = true;
        previous->next = current;
        current->hasPrevious = true;
        current->previous = previous;
        if(previous->hasStart) {
          current->hasStart = true;
          current->start = previous->start;
        } else if (previous->isStart()) {
          current->hasStart = true;
          current->start = previous;
        }
      }
    // for start packets
    } else {
      current->start = current;
      current->hasStart = true;
    }

    // shortcut
    if(current->hasStart && current->hasEnd) {
      currentPacket = current->start;
      receivedPacket = true;
      return;
    }

    // test if all packet available and propogate values of hasEnd and hasStart
    // if connected to or is a start packet
    if (current->hasStart) {
      list<SplitPacket>::iterator it;
      it = current;
      // Indicate to following packet that there is a start
      // or return if found an end
      while(it->hasNext) {
        it = it->next;
        if (it->hasEnd) {
          currentPacket = current->start;
          receivedPacket = true;
          return;
        }
        it->hasStart = true;
        it->start = current->start;
      }
    }
    // if connected to end packet
    if (current->hasEnd) {
      list<SplitPacket>::iterator it;
      it = current;
      while(it->hasPrevious) {
        it = it->previous;
        if (it->hasStart) {
          currentPacket = it->start;
          receivedPacket = true;
          return;
        }
        it->hasEnd = true;
      }
    }

  }
}